

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlCatalogListXMLResolve(xmlCatalogEntryPtr catal,xmlChar *pubID,xmlChar *sysID)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  xmlChar *local_48;
  xmlChar *normid;
  xmlChar *urnID;
  xmlChar *ret;
  xmlChar *sysID_local;
  xmlChar *pubID_local;
  xmlCatalogEntryPtr catal_local;
  
  urnID = (xmlChar *)0x0;
  if (catal == (xmlCatalogEntryPtr)0x0) {
    catal_local = (xmlCatalogEntryPtr)0x0;
  }
  else if ((pubID == (xmlChar *)0x0) && (sysID == (xmlChar *)0x0)) {
    catal_local = (xmlCatalogEntryPtr)0x0;
  }
  else {
    pxVar3 = xmlCatalogNormalizePublic(pubID);
    sysID_local = pubID;
    if (pxVar3 != (xmlChar *)0x0) {
      local_48 = pxVar3;
      if (*pxVar3 == '\0') {
        local_48 = (xmlChar *)0x0;
      }
      sysID_local = local_48;
    }
    iVar2 = xmlStrncmp(sysID_local,(xmlChar *)"urn:publicid:",0xd);
    if (iVar2 == 0) {
      pxVar4 = xmlCatalogUnWrapURN(sysID_local);
      if (xmlDebugCatalogs != 0) {
        if (pxVar4 == (xmlChar *)0x0) {
          pp_Var5 = __xmlGenericError();
          p_Var1 = *pp_Var5;
          ppvVar6 = __xmlGenericErrorContext();
          (*p_Var1)(*ppvVar6,"Public URN ID %s expanded to NULL\n",sysID_local);
        }
        else {
          pp_Var5 = __xmlGenericError();
          p_Var1 = *pp_Var5;
          ppvVar6 = __xmlGenericErrorContext();
          (*p_Var1)(*ppvVar6,"Public URN ID expanded to %s\n",pxVar4);
        }
      }
      catal_local = (xmlCatalogEntryPtr)xmlCatalogListXMLResolve(catal,pxVar4,sysID);
      if (pxVar4 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar4);
      }
      if (pxVar3 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar3);
      }
    }
    else {
      iVar2 = xmlStrncmp(sysID,(xmlChar *)"urn:publicid:",0xd);
      pubID_local = (xmlChar *)catal;
      if (iVar2 == 0) {
        pxVar4 = xmlCatalogUnWrapURN(sysID);
        if (xmlDebugCatalogs != 0) {
          if (pxVar4 == (xmlChar *)0x0) {
            pp_Var5 = __xmlGenericError();
            p_Var1 = *pp_Var5;
            ppvVar6 = __xmlGenericErrorContext();
            (*p_Var1)(*ppvVar6,"System URN ID %s expanded to NULL\n",sysID);
          }
          else {
            pp_Var5 = __xmlGenericError();
            p_Var1 = *pp_Var5;
            ppvVar6 = __xmlGenericErrorContext();
            (*p_Var1)(*ppvVar6,"System URN ID expanded to %s\n",pxVar4);
          }
        }
        if (sysID_local == (xmlChar *)0x0) {
          urnID = xmlCatalogListXMLResolve(catal,pxVar4,(xmlChar *)0x0);
        }
        else {
          iVar2 = xmlStrEqual(sysID_local,pxVar4);
          if (iVar2 == 0) {
            urnID = xmlCatalogListXMLResolve(catal,sysID_local,pxVar4);
          }
          else {
            urnID = xmlCatalogListXMLResolve(catal,sysID_local,(xmlChar *)0x0);
          }
        }
        if (pxVar4 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar4);
        }
        if (pxVar3 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar3);
        }
        catal_local = (xmlCatalogEntryPtr)urnID;
      }
      else {
        for (; pubID_local != (xmlChar *)0x0; pubID_local = *(xmlChar **)pubID_local) {
          if (*(int *)(pubID_local + 0x18) == 1) {
            if (*(long *)(pubID_local + 0x10) == 0) {
              xmlFetchXMLCatalogFile((xmlCatalogEntryPtr)pubID_local);
            }
            if (*(long *)(pubID_local + 0x10) != 0) {
              urnID = xmlCatalogXMLResolve
                                (*(xmlCatalogEntryPtr *)(pubID_local + 0x10),sysID_local,sysID);
              if (urnID != (xmlChar *)0x0) break;
              if (0x32 < *(int *)(*(long *)(pubID_local + 0x10) + 0x40)) {
                urnID = (xmlChar *)0x0;
                break;
              }
            }
          }
        }
        if (pxVar3 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar3);
        }
        catal_local = (xmlCatalogEntryPtr)urnID;
      }
    }
  }
  return (xmlChar *)catal_local;
}

Assistant:

static xmlChar *
xmlCatalogListXMLResolve(xmlCatalogEntryPtr catal, const xmlChar *pubID,
	              const xmlChar *sysID) {
    xmlChar *ret = NULL;
    xmlChar *urnID = NULL;
    xmlChar *normid;

    if (catal == NULL)
        return(NULL);
    if ((pubID == NULL) && (sysID == NULL))
	return(NULL);

    normid = xmlCatalogNormalizePublic(pubID);
    if (normid != NULL)
        pubID = (*normid != 0 ? normid : NULL);

    if (!xmlStrncmp(pubID, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(pubID);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlGenericError(xmlGenericErrorContext,
			"Public URN ID %s expanded to NULL\n", pubID);
	    else
		xmlGenericError(xmlGenericErrorContext,
			"Public URN ID expanded to %s\n", urnID);
	}
	ret = xmlCatalogListXMLResolve(catal, urnID, sysID);
	if (urnID != NULL)
	    xmlFree(urnID);
	if (normid != NULL)
	    xmlFree(normid);
	return(ret);
    }
    if (!xmlStrncmp(sysID, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(sysID);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlGenericError(xmlGenericErrorContext,
			"System URN ID %s expanded to NULL\n", sysID);
	    else
		xmlGenericError(xmlGenericErrorContext,
			"System URN ID expanded to %s\n", urnID);
	}
	if (pubID == NULL)
	    ret = xmlCatalogListXMLResolve(catal, urnID, NULL);
	else if (xmlStrEqual(pubID, urnID))
	    ret = xmlCatalogListXMLResolve(catal, pubID, NULL);
	else {
	    ret = xmlCatalogListXMLResolve(catal, pubID, urnID);
	}
	if (urnID != NULL)
	    xmlFree(urnID);
	if (normid != NULL)
	    xmlFree(normid);
	return(ret);
    }
    while (catal != NULL) {
	if (catal->type == XML_CATA_CATALOG) {
	    if (catal->children == NULL) {
		xmlFetchXMLCatalogFile(catal);
	    }
	    if (catal->children != NULL) {
		ret = xmlCatalogXMLResolve(catal->children, pubID, sysID);
		if (ret != NULL) {
		    break;
                } else if (catal->children->depth > MAX_CATAL_DEPTH) {
	            ret = NULL;
		    break;
	        }
	    }
	}
	catal = catal->next;
    }
    if (normid != NULL)
	xmlFree(normid);
    return(ret);
}